

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O1

BOOL __thiscall
Js::JavascriptProxy::GetEnumerator
          (JavascriptProxy *this,JavascriptStaticEnumerator *enumerator,EnumeratorFlags flags,
          ScriptContext *requestContext,EnumeratorCache *enumeratorCache)

{
  Type *addr;
  ThreadContext *this_00;
  bool bVar1;
  uint uVar2;
  JavascriptArray *pJVar3;
  Recycler *pRVar4;
  JavascriptEnumerator *this_01;
  BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_JsUtil::CharacterBuffer<char16_t>,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_02;
  undefined1 local_a0 [8];
  TrackAllocData data_1;
  TrackAllocData data;
  
  this_00 = requestContext->threadContext;
  if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
    bVar1 = IsRevoked(this);
    if (bVar1) {
      bVar1 = ThreadContext::RecordImplicitException(this_00);
      uVar2 = 0;
      if (bVar1) {
        JavascriptError::ThrowTypeError
                  ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                     javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr,
                   -0x7ff5ea15,L"ownKeys");
      }
    }
    else {
      pJVar3 = JavascriptOperators::GetOwnPropertyNames(this,requestContext);
      data_1._32_8_ =
           &GetEnumerator(Js::JavascriptStaticEnumerator*,Js::EnumeratorFlags,Js::ScriptContext*,Js::EnumeratorCache*)
            ::ProxyOwnkeysEnumerator::typeinfo;
      pRVar4 = Memory::Recycler::TrackAllocInfo
                         (requestContext->recycler,(TrackAllocData *)&data_1.line);
      this_01 = (JavascriptEnumerator *)new<Memory::Recycler>(0x38,pRVar4,0x38bbb2);
      JavascriptEnumerator::JavascriptEnumerator(this_01,requestContext);
      (this_01->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01545910;
      this_01[1].super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject = (_func_int **)0x0;
      addr = &this_01[1].super_RecyclableObject.type;
      Memory::Recycler::WBSetBit((char *)addr);
      this_01[1].super_RecyclableObject.type.ptr = (Type *)pJVar3;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      Memory::Recycler::WBSetBit((char *)(this_01 + 2));
      this_01[2].super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject = (_func_int **)this;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(this_01 + 2);
      this_01[2].super_RecyclableObject.type.ptr = (Type *)requestContext;
      local_a0 = (undefined1  [8])
                 &JsUtil::
                  BaseHashSet<JsUtil::CharacterBuffer<char16_t>,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,JsUtil::CharacterBuffer<char16_t>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
                  ::typeinfo;
      data_1.typeinfo = (type_info *)0x0;
      data_1.plusSize = 0xffffffffffffffff;
      data_1.count = (size_t)anon_var_dwarf_7c580d2;
      data_1.filename._0_4_ = 0x3ed;
      pRVar4 = Memory::Recycler::TrackAllocInfo(requestContext->recycler,(TrackAllocData *)local_a0)
      ;
      this_02 = (BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_JsUtil::CharacterBuffer<char16_t>,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                 *)new<Memory::Recycler>(0x38,pRVar4,0x38bbb2);
      JsUtil::
      BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_JsUtil::CharacterBuffer<char16_t>,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ::BaseDictionary(this_02,requestContext->recycler,0);
      Memory::Recycler::WBSetBit((char *)(this_01 + 1));
      this_01[1].super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject = (_func_int **)this_02;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(this_01 + 1);
      bVar1 = JavascriptStaticEnumerator::Initialize
                        (enumerator,this_01,(ArrayObject *)0x0,(DynamicObject *)0x0,flags,
                         requestContext,enumeratorCache);
      uVar2 = (uint)bVar1;
    }
  }
  else {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_External;
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

BOOL JavascriptProxy::GetEnumerator(JavascriptStaticEnumerator * enumerator, EnumeratorFlags flags, ScriptContext* requestContext, EnumeratorCache * enumeratorCache)
    {
        // Reject implicit call
        ThreadContext* threadContext = requestContext->GetThreadContext();
        if (threadContext->IsDisableImplicitCall())
        {
            threadContext->AddImplicitCallFlags(Js::ImplicitCall_External);
            return FALSE;
        }

        // 1. Assert: Either Type(V) is Object or Type(V) is Null.
        // 2. Let handler be the value of the[[ProxyHandler]] internal slot of O.
        // 3. If handler is null, then throw a TypeError exception.
        if (IsRevoked())
        {
            // the proxy has been revoked; TypeError.
            if (!threadContext->RecordImplicitException())
                return FALSE;
            JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_ErrorOnRevokedProxy, _u("ownKeys"));
        }

        struct ProxyOwnkeysEnumerator : public JavascriptEnumerator
        {
            typedef JsUtil::BaseHashSet<JsUtil::CharacterBuffer<WCHAR>, Recycler> VisitedNamesHashSet;
            Field(VisitedNamesHashSet*) visited;
            Field(JavascriptArray*) trapResult;
            Field(JavascriptProxy*) proxy;
            FieldNoBarrier(ScriptContext*) scriptContext;
            Field(uint32) index;

            DEFINE_VTABLE_CTOR_ABSTRACT(ProxyOwnkeysEnumerator, JavascriptEnumerator)

            ProxyOwnkeysEnumerator(ScriptContext* scriptContext, JavascriptProxy* proxy, JavascriptArray* trapResult)
                :JavascriptEnumerator(scriptContext), scriptContext(scriptContext), proxy(proxy), trapResult(trapResult)
            {
                visited = RecyclerNew(scriptContext->GetRecycler(), VisitedNamesHashSet, scriptContext->GetRecycler());
            }
            virtual void Reset() override
            {
                index = 0;
                visited->Reset();
            }

            virtual JavascriptString * MoveAndGetNext(PropertyId& propertyId, PropertyAttributes* attributes = nullptr) override
            {
                propertyId = Constants::NoProperty;
                if (attributes != nullptr)
                {
                    *attributes = PropertyEnumerable;
                }
                // 13.7.5.15 EnumerateObjectProperties(O) (https://tc39.github.io/ecma262/#sec-enumerate-object-properties)
                // for (let key of Reflect.ownKeys(obj)) {
                uint32 len = trapResult->GetLength();
                while (index < len)
                {
                    Var var = trapResult->DirectGetItem(index++) ;
                    if (var)
                    {
                        // if (typeof key === "string") {
                        if (VarIs<JavascriptString>(var))
                        {
                            JavascriptString* propertyName = VarTo<JavascriptString>(var);
                            // let desc = Reflect.getOwnPropertyDescriptor(obj, key);
                            Js::PropertyDescriptor desc;
                            BOOL ret = JavascriptOperators::GetOwnPropertyDescriptor(proxy, propertyName, scriptContext, &desc);
                            const JsUtil::CharacterBuffer<WCHAR> propertyString(propertyName->GetString(), propertyName->GetLength());
                            // if (desc && !visited.has(key)) {
                            if (ret && !visited->Contains(propertyString))
                            {
                                visited->Add(propertyString);
                                // if (desc.enumerable) yield key;
                                if (desc.IsEnumerable())
                                {
                                    return VarTo<JavascriptString>(CrossSite::MarshalVar(
                                      scriptContext, propertyName, propertyName->GetScriptContext()));
                                }
                            }
                        }
                    }
                }
                return nullptr;
            }
        };

        JavascriptArray* trapResult = JavascriptOperators::GetOwnPropertyNames(this, requestContext);
        ProxyOwnkeysEnumerator* ownKeysEnum = RecyclerNew(requestContext->GetRecycler(), ProxyOwnkeysEnumerator, requestContext, this, trapResult);

        return enumerator->Initialize(ownKeysEnum, nullptr, nullptr, flags, requestContext, enumeratorCache);
    }